

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

void M_SaveJoystickConfig(IJoystickConfig *joy)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  uint local_64;
  int i;
  int numaxes;
  int axislen;
  char value [32];
  char key [32];
  IJoystickConfig *joy_local;
  
  bVar1 = M_SetJoystickConfigSection(joy,true);
  if (bVar1) {
    FConfigFile::ClearCurrentSection(&GameConfig->super_FConfigFile);
    uVar2 = (*joy->_vptr_IJoystickConfig[0xd])();
    if ((uVar2 & 1) == 0) {
      (*joy->_vptr_IJoystickConfig[3])();
      mysnprintf((char *)&numaxes,0x20,"%g",(double)extraout_XMM0_Da);
      FConfigFile::SetValueForKey
                (&GameConfig->super_FConfigFile,"Sensitivity",(char *)&numaxes,false);
    }
    iVar3 = (*joy->_vptr_IJoystickConfig[5])();
    for (local_64 = 0; (int)local_64 < iVar3; local_64 = local_64 + 1) {
      iVar4 = mysnprintf(value + 0x18,0x20,"Axis%u");
      uVar2 = (*joy->_vptr_IJoystickConfig[0xe])(joy,(ulong)local_64);
      if ((uVar2 & 1) == 0) {
        mysnprintf(value + (long)iVar4 + 0x18,0x20 - (long)iVar4,"deadzone");
        (*joy->_vptr_IJoystickConfig[6])(joy,(ulong)local_64);
        mysnprintf((char *)&numaxes,0x20,"%g",(double)extraout_XMM0_Da_00);
        FConfigFile::SetValueForKey
                  (&GameConfig->super_FConfigFile,value + 0x18,(char *)&numaxes,false);
      }
      uVar2 = (*joy->_vptr_IJoystickConfig[0x10])(joy,(ulong)local_64);
      if ((uVar2 & 1) == 0) {
        mysnprintf(value + (long)iVar4 + 0x18,0x20 - (long)iVar4,"scale");
        (*joy->_vptr_IJoystickConfig[9])(joy,(ulong)local_64);
        mysnprintf((char *)&numaxes,0x20,"%g",(double)extraout_XMM0_Da_01);
        FConfigFile::SetValueForKey
                  (&GameConfig->super_FConfigFile,value + 0x18,(char *)&numaxes,false);
      }
      uVar2 = (*joy->_vptr_IJoystickConfig[0xf])(joy,(ulong)local_64);
      if ((uVar2 & 1) == 0) {
        mysnprintf(value + (long)iVar4 + 0x18,0x20 - (long)iVar4,"map");
        (*joy->_vptr_IJoystickConfig[7])(joy,(ulong)local_64);
        mysnprintf((char *)&numaxes,0x20,"%d");
        FConfigFile::SetValueForKey
                  (&GameConfig->super_FConfigFile,value + 0x18,(char *)&numaxes,false);
      }
    }
    bVar1 = FConfigFile::SectionIsEmpty(&GameConfig->super_FConfigFile);
    if (bVar1) {
      FConfigFile::DeleteCurrentSection(&GameConfig->super_FConfigFile);
    }
  }
  return;
}

Assistant:

void M_SaveJoystickConfig(IJoystickConfig *joy)
{
	char key[32], value[32];
	int axislen, numaxes;

	if (M_SetJoystickConfigSection(joy, true))
	{
		GameConfig->ClearCurrentSection();
		if (!joy->IsSensitivityDefault())
		{
			mysnprintf(value, countof(value), "%g", joy->GetSensitivity());
			GameConfig->SetValueForKey("Sensitivity", value);
		}
		numaxes = joy->GetNumAxes();
		for (int i = 0; i < numaxes; ++i)
		{
			axislen = mysnprintf(key, countof(key), "Axis%u", i);

			if (!joy->IsAxisDeadZoneDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "deadzone");
				mysnprintf(value, countof(value), "%g", joy->GetAxisDeadZone(i));
				GameConfig->SetValueForKey(key, value);
			}
			if (!joy->IsAxisScaleDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "scale");
				mysnprintf(value, countof(value), "%g", joy->GetAxisScale(i));
				GameConfig->SetValueForKey(key, value);
			}
			if (!joy->IsAxisMapDefault(i))
			{
				mysnprintf(key + axislen, countof(key) - axislen, "map");
				mysnprintf(value, countof(value), "%d", joy->GetAxisMap(i));
				GameConfig->SetValueForKey(key, value);
			}
		}
		// If the joystick is entirely at its defaults, delete this section
		// so that we don't write out a lone section header.
		if (GameConfig->SectionIsEmpty())
		{
			GameConfig->DeleteCurrentSection();
		}
	}
}